

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O1

CURLcode get_url_file_name(GlobalConfig *global,char **filename,char *url)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *__s;
  char *path;
  char *local_30;
  
  lVar2 = curl_url();
  local_30 = (char *)0x0;
  if (lVar2 == 0) {
    return CURLE_OUT_OF_MEMORY;
  }
  *filename = (char *)0x0;
  iVar1 = curl_url_set(lVar2,0,url,0x200);
  if (iVar1 == 0) {
    iVar1 = curl_url_get(lVar2,7,&local_30,0);
    curl_url_cleanup(lVar2);
    if (iVar1 == 0) {
      iVar1 = 1;
      do {
        pcVar4 = local_30;
        pcVar3 = strrchr(local_30,0x2f);
        __s = pcVar3 + 1;
        if (pcVar3 == (char *)0x0) {
          __s = pcVar4;
        }
        pcVar4 = strrchr(__s,0x5c);
        if (pcVar4 == (char *)0x0) {
          pcVar4 = pcVar3;
        }
        if (((pcVar4 != (char *)0x0) && (iVar1 == 1)) && (pcVar4[1] == '\0')) {
          *pcVar4 = '\0';
        }
        iVar1 = iVar1 + -1;
      } while (iVar1 == 0);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = strdup("curl_response");
        *filename = pcVar4;
        warnf(global,"No remote file name, uses \"%s\"",pcVar4);
      }
      else {
        pcVar4 = strdup(pcVar4 + 1);
        *filename = pcVar4;
      }
      curl_free(local_30);
      if (*filename == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      return CURLE_OK;
    }
    lVar2 = 0;
  }
  curl_url_cleanup(lVar2);
  if (iVar1 < 7) {
    if (iVar1 == 1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if (iVar1 == 5) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
  }
  else {
    if (iVar1 == 7) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (iVar1 == 0x1e) {
      return CURLE_NOT_BUILT_IN;
    }
  }
  return CURLE_URL_MALFORMAT;
}

Assistant:

CURLcode get_url_file_name(struct GlobalConfig *global,
                           char **filename, const char *url)
{
  CURLU *uh = curl_url();
  char *path = NULL;
  CURLUcode uerr;

  if(!uh)
    return CURLE_OUT_OF_MEMORY;

  *filename = NULL;

  uerr = curl_url_set(uh, CURLUPART_URL, url, CURLU_GUESS_SCHEME);
  if(!uerr) {
    uerr = curl_url_get(uh, CURLUPART_PATH, &path, 0);
    curl_url_cleanup(uh);
    uh = NULL;
    if(!uerr) {
      int i;
      char *pc = NULL, *pc2 = NULL;
      for(i = 0; i < 2; i++) {
        pc = strrchr(path, '/');
        pc2 = strrchr(pc ? pc + 1 : path, '\\');
        if(pc2)
          pc = pc2;
        if(pc && !pc[1] && !i) {
          /* if the path ends with slash, try removing the trailing one
             and get the last directory part */
          *pc = 0;
        }
      }

      if(pc) {
        /* duplicate the string beyond the slash */
        *filename = strdup(pc + 1);
      }
      else {
        /* no slash => empty string, use default */
        *filename = strdup("curl_response");
        warnf(global, "No remote file name, uses \"%s\"", *filename);
      }

      curl_free(path);
      if(!*filename)
        return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
      {
        char *sanitized;
        SANITIZEcode sc = sanitize_file_name(&sanitized, *filename, 0);
        curlx_safefree(*filename);
        if(sc) {
          if(sc == SANITIZE_ERR_OUT_OF_MEMORY)
            return CURLE_OUT_OF_MEMORY;
          return CURLE_URL_MALFORMAT;
        }
        *filename = sanitized;
      }
#endif /* _WIN32 || MSDOS */

      return CURLE_OK;
    }
  }
  curl_url_cleanup(uh);
  return urlerr_cvt(uerr);
}